

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::contextMenuEvent(QPlainTextEdit *this,QContextMenuEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  LayoutDirection LVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_01 = this_00->control;
  LVar1 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar1 == RightToLeft) {
    iVar2 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar3 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar2 = iVar2 - iVar3;
  }
  else {
    iVar2 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar4 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  local_38.yp = qVar4 + this_00->topLineFracture;
  local_38.xp = (double)iVar2;
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)e,&local_38,
             (this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::contextMenuEvent(QContextMenuEvent *e)
{
    Q_D(QPlainTextEdit);
    d->sendControlEvent(e);
}